

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall tinyusdz::crate::CrateReader::ReadReference(CrateReader *this,Reference *d)

{
  pointer pPVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  PathIndex index;
  CustomDataType customData;
  string assetPath;
  optional<tinyusdz::Path> path;
  ostringstream ss_e;
  Index local_2fc;
  undefined1 *local_2f8;
  _Rb_tree_node_base local_2f0;
  size_t local_2d0;
  string local_2c8;
  LayerOffset local_2a8;
  ostringstream local_298;
  undefined7 uStack_297;
  Path local_290;
  undefined1 local_1c0 [16];
  char local_1b0 [8];
  undefined1 local_1a8 [8];
  _Alloc_hider local_1a0;
  char *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  ios_base local_150 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108 [12];
  long *local_48;
  long local_38 [2];
  
  if (d == (Reference *)0x0) {
    return false;
  }
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  bVar2 = ReadString(this,&local_2c8);
  if (bVar2) {
    local_2fc.value = 0xffffffff;
    bVar2 = ReadIndex(this,&local_2fc);
    if (bVar2) {
      uVar3 = (ulong)local_2fc.value;
      pPVar1 = (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar1 >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
        local_298 = (ostringstream)0x0;
      }
      else {
        local_1c0[0] = (ostringstream)0x1;
        Path::Path((Path *)(local_1c0 + 8),pPVar1 + uVar3);
        local_298 = local_1c0[0];
        if ((local_1c0._0_8_ & 1) != 0) {
          Path::Path(&local_290,(Path *)(local_1c0 + 8));
        }
        if (((byte)local_1c0[0] & 1) != 0) {
          if (local_118 != local_108) {
            operator_delete(local_118,local_108[0]._M_allocated_capacity + 1);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138,local_128._M_allocated_capacity + 1);
          }
          if (local_158 != &local_148) {
            operator_delete(local_158,local_148._M_allocated_capacity + 1);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178,local_168._M_allocated_capacity + 1);
          }
          if (local_198 != local_190._M_local_buf + 8) {
            operator_delete(local_198,local_190._8_8_ + 1);
          }
          if ((undefined1 *)local_1c0._8_8_ != local_1a8) {
            operator_delete((void *)local_1c0._8_8_,(long)local_1a8 + 1);
          }
        }
      }
      if (local_298 == (ostringstream)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"ReadReference",0xd);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0x3f5);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        pcVar7 = "Invalid Path index in Reference ValueRep.";
        lVar6 = 0x29;
LAB_001b5bfc:
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,pcVar7,lVar6);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2f8);
        if ((_Base_ptr *)local_2f8 != &local_2f0._M_parent) {
          operator_delete(local_2f8,
                          (ulong)((long)&((_Rb_tree_node_base *)&(local_2f0._M_parent)->_M_color)->
                                         _M_color + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
        ::std::ios_base::~ios_base(local_150);
        bVar2 = false;
      }
      else {
        local_2a8._offset._0_4_ = 0;
        local_2a8._offset._4_4_ = 0;
        local_2a8._scale._0_4_ = 0;
        local_2a8._scale._4_4_ = 0x3ff00000;
        bVar2 = ReadLayerOffset(this,&local_2a8);
        if (!bVar2) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"ReadReference",0xd);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0x3fa);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          pcVar7 = "Failed to read LayerOffset in Reference ValueRep.";
          lVar6 = 0x31;
          goto LAB_001b5bfc;
        }
        local_2f0._M_left = &local_2f0;
        local_2f0._M_color = _S_red;
        local_2f0._M_parent = (_Base_ptr)0x0;
        local_2d0 = 0;
        local_2f0._M_right = local_2f0._M_left;
        bVar2 = ReadCustomData(this,(CustomDataType *)&local_2f8);
        if (bVar2) {
          local_1c0._0_8_ = local_1b0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1c0,local_2c8._M_dataplus._M_p,
                     local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
          local_1a0._M_p = (pointer)&local_190;
          local_198 = (char *)0x0;
          local_190._M_local_buf[0] = '\0';
          ::std::__cxx11::string::operator=((string *)d,(string *)local_1c0);
          ::std::__cxx11::string::operator=
                    ((string *)&(d->asset_path).resolved_path_,(string *)(local_1a8 + 8));
          tinyusdz::value::AssetPath::~AssetPath((AssetPath *)local_1c0);
          if (local_298 == (ostringstream)0x0) {
            __assert_fail("has_value()",
                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                          ,0x591,
                          "value_type &nonstd::optional_lite::optional<tinyusdz::Path>::value() [T = tinyusdz::Path]"
                         );
          }
          Path::operator=(&d->prim_path,&local_290);
          (d->layerOffset)._offset =
               (double)CONCAT44(local_2a8._offset._4_4_,local_2a8._offset._0_4_);
          (d->layerOffset)._scale = (double)CONCAT44(local_2a8._scale._4_4_,local_2a8._scale._0_4_);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       *)&d->customData,
                      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                       *)&local_2f8);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"ReadReference",0xd);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
          poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0x3ff);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"Failed to read CustomData(Dict) in Reference ValueRep.",
                     0x36);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_48);
          if (local_48 != local_38) {
            operator_delete(local_48,local_38[0] + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
          ::std::ios_base::~ios_base(local_150);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)&local_2f8,(_Link_type)local_2f0._M_parent);
      }
      if (local_298 == (ostringstream)0x1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._element._M_dataplus._M_p != &local_290._element.field_2) {
          operator_delete(local_290._element._M_dataplus._M_p,
                          local_290._element.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._variant_part_str._M_dataplus._M_p != &local_290._variant_part_str.field_2)
        {
          operator_delete(local_290._variant_part_str._M_dataplus._M_p,
                          local_290._variant_part_str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._variant_selection_part._M_dataplus._M_p !=
            &local_290._variant_selection_part.field_2) {
          operator_delete(local_290._variant_selection_part._M_dataplus._M_p,
                          local_290._variant_selection_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._variant_part._M_dataplus._M_p != &local_290._variant_part.field_2) {
          operator_delete(local_290._variant_part._M_dataplus._M_p,
                          local_290._variant_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._prop_part._M_dataplus._M_p != &local_290._prop_part.field_2) {
          operator_delete(local_290._prop_part._M_dataplus._M_p,
                          local_290._prop_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._prim_part._M_dataplus._M_p != &local_290._prim_part.field_2) {
          operator_delete(local_290._prim_part._M_dataplus._M_p,
                          local_290._prim_part.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_001b5958;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"ReadReference",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0x3f0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar7 = "Failed to read primPath Index in Reference ValueRep.";
    lVar6 = 0x34;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"ReadReference",0xd);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"():",3);
    poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c0,0x3eb);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    pcVar7 = "Failed to read assetPath in Reference ValueRep.";
    lVar6 = 0x2f;
  }
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,pcVar7,lVar6);
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::_M_append((char *)&this->_err,CONCAT71(uStack_297,local_298));
  if ((size_type *)CONCAT71(uStack_297,local_298) != &local_290._prim_part._M_string_length) {
    operator_delete((undefined1 *)CONCAT71(uStack_297,local_298),
                    local_290._prim_part._M_string_length + 1);
  }
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
  ::std::ios_base::~ios_base(local_150);
  bVar2 = false;
LAB_001b5958:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                             local_2c8.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool CrateReader::ReadReference(Reference *d) {

  if (!d) {
    return false;
  }

  // assetPath : string
  // primPath : Path
  // layerOffset : LayerOffset
  // customData : Dict

  std::string assetPath;
  if (!ReadString(&assetPath)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read assetPath in Reference ValueRep.");
  }

  crate::PathIndex index;
  if (!ReadIndex(&index)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read primPath Index in Reference ValueRep.");
  }

  auto path = GetPath(index);
  if (!path) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Path index in Reference ValueRep.");
  }

  LayerOffset layerOffset;
  if (!ReadLayerOffset(&layerOffset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read LayerOffset in Reference ValueRep.");
  }

  CustomDataType customData;
  if (!ReadCustomData(&customData)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read CustomData(Dict) in Reference ValueRep.");
  }

  d->asset_path = assetPath;
  d->prim_path = path.value();
  d->layerOffset = layerOffset;
  d->customData = customData;

  return true;
}